

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall MT32Emu::Synth::playSysexNow(Synth *this,Bit8u *sysex,Bit32u len)

{
  uint local_20;
  Bit32u endPos;
  Bit32u len_local;
  Bit8u *sysex_local;
  Synth *this_local;
  
  if (len < 2) {
    printDebug(this,"playSysex: Message is too short for sysex (%d bytes)",(ulong)len);
  }
  if (*sysex == 0xf0) {
    for (local_20 = 1; (local_20 < len && (sysex[local_20] != 0xf7)); local_20 = local_20 + 1) {
    }
    if (local_20 == len) {
      printDebug(this,"playSysex: Message lacks end-of-sysex (0xf7)");
    }
    else {
      playSysexWithoutFraming(this,sysex + 1,local_20 - 1);
    }
  }
  else {
    printDebug(this,"playSysex: Message lacks start-of-sysex (0xF0)");
  }
  return;
}

Assistant:

void Synth::playSysexNow(const Bit8u *sysex, Bit32u len) {
	if (len < 2) {
		printDebug("playSysex: Message is too short for sysex (%d bytes)", len);
	}
	if (sysex[0] != 0xF0) {
		printDebug("playSysex: Message lacks start-of-sysex (0xF0)");
		return;
	}
	// Due to some programs (e.g. Java) sending buffers with junk at the end, we have to go through and find the end marker rather than relying on len.
	Bit32u endPos;
	for (endPos = 1; endPos < len; endPos++) {
		if (sysex[endPos] == 0xF7) {
			break;
		}
	}
	if (endPos == len) {
		printDebug("playSysex: Message lacks end-of-sysex (0xf7)");
		return;
	}
	playSysexWithoutFraming(sysex + 1, endPos - 1);
}